

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O2

void __thiscall
adios2::query::BlockIndex<long_double>::RunStatMinBlocksInfo
          (BlockIndex<long_double> *this,QueryVar *query,MinVarInfo *MinBlocksInfo,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *hitBlocks)

{
  pointer pMVar1;
  bool bVar2;
  ulong uVar3;
  pointer pMVar4;
  Dims cc;
  Dims ss;
  Box<adios2::Dims> box;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  longdouble local_a8;
  longdouble local_98;
  BlockHit local_80;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  
  pMVar1 = (MinBlocksInfo->BlocksInfo).
           super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar4 = (MinBlocksInfo->BlocksInfo).
                super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar4 != pMVar1; pMVar4 = pMVar4 + 1) {
    local_98 = (pMVar4->MinMax).MinUnion.field_ldouble;
    local_a8 = (pMVar4->MinMax).MaxUnion.field_ldouble;
    bVar2 = RangeTree::CheckInterval<long_double>(&query->m_RangeTree,&local_98,&local_a8);
    if (bVar2) {
      if ((this->m_VarPtr->super_VariableBase).m_ShapeID == LocalArray) {
        BlockHit::BlockHit((BlockHit *)&local_60,pMVar4->BlockID);
        std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
        emplace_back<adios2::query::BlockHit>(hitBlocks,(BlockHit *)&local_60);
        std::
        vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::~vector((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)&local_60.first.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish);
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c0,
                   (long)MinBlocksInfo->Dims,(allocator_type *)&local_60);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                   (long)MinBlocksInfo->Dims,(allocator_type *)&local_60);
        for (uVar3 = 0;
            uVar3 < (ulong)((long)local_c0._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_c0._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar3 = uVar3 + 1) {
          local_c0._M_impl.super__Vector_impl_data._M_start[uVar3] = pMVar4->Start[uVar3];
          local_d8._M_impl.super__Vector_impl_data._M_start[uVar3] = pMVar4->Count[uVar3];
        }
        bVar2 = QueryVar::TouchSelection(query,(Dims *)&local_c0,(Dims *)&local_d8);
        if (bVar2) {
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                    (&local_60,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c0,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8);
          BlockHit::BlockHit(&local_80,pMVar4->BlockID,&local_60);
          std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
          emplace_back<adios2::query::BlockHit>(hitBlocks,&local_80);
          std::
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::~vector(&local_80.m_Regions);
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~pair(&local_60);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d8)
          ;
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_c0)
          ;
        }
        else {
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d8)
          ;
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_c0)
          ;
        }
      }
    }
  }
  return;
}

Assistant:

void RunStatMinBlocksInfo(const QueryVar &query, const adios2::MinVarInfo *MinBlocksInfo,
                              std::vector<BlockHit> &hitBlocks)
    {
        for (auto &blockInfo : MinBlocksInfo->BlocksInfo)
        {
            T bmin = *(T *)&blockInfo.MinMax.MinUnion;
            T bmax = *(T *)&blockInfo.MinMax.MaxUnion;
            bool isHit = query.m_RangeTree.CheckInterval(bmin, bmax);

            if (!isHit)
                continue;

            if (m_VarPtr->m_ShapeID != adios2::ShapeID::LocalArray)
            {
                Dims ss(MinBlocksInfo->Dims);
                Dims cc(MinBlocksInfo->Dims);
                for (std::vector<int>::size_type i = 0; i < ss.size(); i++)
                {
                    ss[i] = blockInfo.Start[i];
                    cc[i] = blockInfo.Count[i];
                }
                if (!query.TouchSelection(ss, cc))
                    continue;

                if (isHit)
                {
                    adios2::Box<adios2::Dims> box = {ss, cc};
                    hitBlocks.push_back(BlockHit(blockInfo.BlockID, box));
                }
            }
            else
            { // local array
                hitBlocks.push_back(BlockHit(blockInfo.BlockID));
            }
        }
    }